

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O1

void __thiscall
TcpServer::BindNewConnection
          (TcpServer *this,
          function<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&,_void_*)>
          *fnNewConnection)

{
  BaseSocketImpl *pBVar1;
  long *plVar2;
  _Any_data _Stack_38;
  code *local_28;
  
  pBVar1 = (this->super_BaseSocket).Impl_._M_t.
           super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
           super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
           super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl;
  if (pBVar1 == (BaseSocketImpl *)0x0) {
    plVar2 = (long *)0x0;
  }
  else {
    plVar2 = (long *)__dynamic_cast(pBVar1,&BaseSocketImpl::typeinfo,&TcpServerImpl::typeinfo,0);
  }
  std::function<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&,_void_*)>::
  function((function<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&,_void_*)>
            *)&_Stack_38,fnNewConnection);
  (**(code **)(*plVar2 + 0x90))(plVar2,&_Stack_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&_Stack_38,&_Stack_38,__destroy_functor);
  }
  return;
}

Assistant:

void TcpServer::BindNewConnection(std::function<void(const std::vector<TcpSocket*>&, void*)> fnNewConnection)
{
    dynamic_cast<TcpServerImpl*>(GetImpl())->BindNewConnection(fnNewConnection);
}